

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.hpp
# Opt level: O0

void supermap::io::SerializeHelper<supermap::ByteArray<4096UL>,_void>::serialize
               (ByteArray<4096UL> *ar,ostream *os)

{
  char *pcVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  unsigned_long in_stack_ffffffffffffffa8;
  string local_30 [48];
  
  pcVar1 = ByteArray<4096UL>::getCharsPointer((ByteArray<4096UL> *)0x294db1);
  std::ostream::write((char *)in_RSI,(long)pcVar1);
  uVar2 = std::ios::good();
  if ((uVar2 & 1) == 0) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    std::__cxx11::to_string(in_stack_ffffffffffffffa8);
    std::operator+((char *)in_RSI,__rhs);
    std::operator+(in_RSI,(char *)__rhs);
    supermap::IOException::IOException((IOException *)__rhs,local_30);
    __cxa_throw(__rhs,&IOException::typeinfo,IOException::~IOException);
  }
  return;
}

Assistant:

static void serialize(const ByteArray<Len> &ar, std::ostream &os) {
        os.write(ar.getCharsPointer(), Len);
        if (!os.good()) {
            throw IOException("Unsuccessful serialization, expected to write " + std::to_string(Len) + " bytes");
        }
    }